

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bitwidth_t __thiscall slang::SVInt::countXs(SVInt *this)

{
  uint32_t uVar1;
  _If_is_unsigned_integer<unsigned_long,_int> _Var2;
  long in_RDI;
  uint32_t i;
  uint32_t words;
  bitwidth_t count;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0xd) & 1) == 0) {
    local_4 = 0;
  }
  else {
    local_14 = 0;
    uVar1 = getNumWords(*(bitwidth_t *)(in_RDI + 8),false);
    for (local_1c = 0; local_1c < uVar1; local_1c = local_1c + 1) {
      _Var2 = std::popcount<unsigned_long>(0x262a27);
      local_14 = _Var2 + local_14;
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

bitwidth_t SVInt::countXs() const {
    if (!unknownFlag)
        return 0;

    bitwidth_t count = 0;
    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++)
        count += (bitwidth_t)std::popcount(~pVal[i] & pVal[i + words]);

    return count;
}